

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void PrintEscapedTypeName(ExpressionTranslateContext *ctx,TypeBase *type)

{
  ScopeData *pSVar1;
  
  if ((type != (TypeBase *)0x0) && (type->typeID == 0x18)) {
    pSVar1 = (ScopeData *)type[2].importModule;
    if (pSVar1->ownerFunction == (FunctionData *)0x0) {
      if (((pSVar1 != ctx->ctx->globalScope) && ((ByteCode *)pSVar1->ownerType == (ByteCode *)0x0))
         && (pSVar1->ownerNamespace == (NamespaceData *)0x0)) {
        Print(ctx,"scope_%d_",(ulong)*(uint *)&((InplaceStr *)&pSVar1->uniqueId)->begin);
      }
    }
    else {
      TranslateFunctionName(ctx,pSVar1->ownerFunction);
      Print(ctx,"_");
    }
  }
  PrintEscapedName(ctx,type->name);
  return;
}

Assistant:

void PrintEscapedTypeName(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->scope->ownerFunction)
		{
			TranslateFunctionName(ctx, typeClass->scope->ownerFunction);
			Print(ctx, "_");
		}
		else if(typeClass->scope != ctx.ctx.globalScope && !typeClass->scope->ownerType && !typeClass->scope->ownerFunction && !typeClass->scope->ownerNamespace)
		{
			Print(ctx, "scope_%d_", typeClass->scope->uniqueId);
		}

		PrintEscapedName(ctx, typeClass->name);
	}
	else
	{
		PrintEscapedName(ctx, type->name);
	}
}